

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateCommandResultMultiSuccessNoErrors
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,bool raii)

{
  size_t *__return_storage_ptr___00;
  value_type vVar1;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_00;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  size_type sVar7;
  pointer ppVar8;
  allocator<char> local_193;
  allocator<Flags<CommandFlavourFlagBits>_> local_192;
  Flags<CommandFlavourFlagBits> local_191;
  Flags<CommandFlavourFlagBits> *local_190;
  size_type local_188;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_180;
  allocator<Flags<CommandFlavourFlagBits>_> local_163;
  Flags<CommandFlavourFlagBits> local_162;
  Flags<CommandFlavourFlagBits> local_161;
  Flags<CommandFlavourFlagBits> *local_160;
  size_type local_158;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_150;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_138;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_108;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_f0;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_e8;
  undefined1 local_e0 [8];
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_1;
  undefined1 local_a8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> constPointerParams;
  undefined1 local_80 [8];
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams;
  bool raii_local;
  bool definition_local;
  size_t initialSkipCount_local;
  CommandData *commandData_local;
  string *name_local;
  VulkanHppGenerator *this_local;
  
  __return_storage_ptr___00 = &vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count;
  determineReturnParams
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__return_storage_ptr___00,this
             ,&commandData->params);
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     __return_storage_ptr___00);
  if (sVar3 == 0) {
    determineVectorParams
              ((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                *)local_80,this,&commandData->params);
    bVar2 = std::
            map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
            ::empty((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                     *)local_80);
    if (bVar2) {
      determineConstPointerParams
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a8,this,
                 &commandData->params);
      vectorParams_1._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ =
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a8);
      if (vectorParams_1._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_) {
        generateCommandSetExclusive
                  (__return_storage_ptr__,this,name,commandData,initialSkipCount,definition,raii);
      }
      vectorParams_1._M_t._M_impl.super__Rb_tree_header._M_node_count._5_3_ = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a8);
      if (vectorParams_1._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 0)
      goto LAB_001638f5;
    }
    else {
LAB_001638f5:
      vectorParams_1._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
    }
    std::
    map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
    ::~map((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
            *)local_80);
joined_r0x00163910:
    if (vectorParams_1._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != 0)
    goto LAB_00163f90;
  }
  else if ((sVar3 == 2) &&
          (sVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&commandData->successCodes), sVar3 == 2)) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&commandData->successCodes,0);
    bVar2 = std::operator==(pvVar4,"VK_SUCCESS");
    if (bVar2) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&commandData->successCodes,1);
      bVar2 = std::operator==(pvVar4,"VK_INCOMPLETE");
      if (!bVar2) goto LAB_00163f2c;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count,0);
      pvVar6 = std::
               vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
               ::operator[](&commandData->params,*pvVar5);
      bVar2 = std::operator==(&(pvVar6->type).type,"size_t");
      if (!bVar2) {
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            &vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count,0);
        pvVar6 = std::
                 vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                 ::operator[](&commandData->params,*pvVar5);
        bVar2 = std::operator==(&(pvVar6->type).type,"uint32_t");
        if (!bVar2) goto LAB_00163f2c;
      }
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
      pvVar6 = std::
               vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
               ::operator[](&commandData->params,*pvVar5);
      bVar2 = std::operator==(&(pvVar6->type).type,"void");
      if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_00163f2c;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
      pvVar6 = std::
               vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
               ::operator[](&commandData->params,*pvVar5);
      bVar2 = isHandleType(this,&(pvVar6->type).type);
      if (bVar2) goto LAB_00163f2c;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
      pvVar6 = std::
               vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
               ::operator[](&commandData->params,*pvVar5);
      bVar2 = isStructureChainAnchor(this,&(pvVar6->type).type);
      if (bVar2) goto LAB_00163f2c;
      determineVectorParams
                ((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                  *)local_e0,this,&commandData->params);
      sVar7 = std::
              map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
              ::size((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                      *)local_e0);
      if (sVar7 == 1) {
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            &vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count,0);
        vVar1 = *pvVar5;
        local_e8._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
             ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                      *)local_e0);
        ppVar8 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                 ::operator->(&local_e8);
        if (vVar1 != (ppVar8->second).lenParam) goto LAB_00163eeb;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            &vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
        vVar1 = *pvVar5;
        local_f0._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
             ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                      *)local_e0);
        ppVar8 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                 ::operator->(&local_f0);
        if (vVar1 != ppVar8->first) goto LAB_00163eeb;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_108,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::
        map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::map(&local_138,
              (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
               *)local_e0);
        Flags<CommandFlavourFlagBits>::Flags(&local_162,enhanced);
        Flags<CommandFlavourFlagBits>::Flags(&local_161,withAllocator);
        local_158 = 2;
        local_160 = &local_162;
        std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_163);
        __l_00._M_len = local_158;
        __l_00._M_array = local_160;
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::vector(&local_150,__l_00,&local_163);
        Flags<CommandFlavourFlagBits>::Flags(&local_191,enhanced);
        local_188 = 1;
        local_190 = &local_191;
        std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_192);
        __l._M_len = local_188;
        __l._M_array = local_190;
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::vector(&local_180,__l,&local_192);
        generateCommandSetInclusive
                  (__return_storage_ptr__,this,name,commandData,initialSkipCount,definition,
                   &local_108,&local_138,false,&local_150,raii,false,&local_180);
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::~vector(&local_180);
        std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_192);
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::~vector(&local_150);
        std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_163);
        std::
        map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::~map(&local_138);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_108);
        vectorParams_1._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
      }
      else {
LAB_00163eeb:
        vectorParams_1._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      }
      std::
      map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
      ::~map((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
              *)local_e0);
      goto joined_r0x00163910;
    }
  }
LAB_00163f2c:
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_193)
  ;
  std::allocator<char>::~allocator(&local_193);
  vectorParams_1._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
LAB_00163f90:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCommandResultMultiSuccessNoErrors(
  std::string const & name, CommandData const & commandData, size_t initialSkipCount, bool definition, bool raii ) const
{
  std::vector<size_t> returnParams = determineReturnParams( commandData.params );
  switch ( returnParams.size() )
  {
    case 0:
      {
        std::map<size_t, VectorParamData> vectorParams = determineVectorParams( commandData.params );
        if ( vectorParams.empty() )
        {
          std::vector<size_t> constPointerParams = determineConstPointerParams( commandData.params );
          if ( constPointerParams.empty() )
          {
            return generateCommandSetExclusive( name, commandData, initialSkipCount, definition, raii );
          }
        }
      }
      break;
    case 2:
      if ( ( commandData.successCodes.size() == 2 ) && ( commandData.successCodes[0] == "VK_SUCCESS" ) && ( commandData.successCodes[1] == "VK_INCOMPLETE" ) )
      {
        if ( ( commandData.params[returnParams[0]].type.type == "size_t" ) || ( commandData.params[returnParams[0]].type.type == "uint32_t" ) )
        {
          if ( ( commandData.params[returnParams[1]].type.type != "void" ) && !isHandleType( commandData.params[returnParams[1]].type.type ) &&
               !isStructureChainAnchor( commandData.params[returnParams[1]].type.type ) )
          {
            std::map<size_t, VectorParamData> vectorParams = determineVectorParams( commandData.params );
            if ( vectorParams.size() == 1 )
            {
              if ( returnParams[0] == vectorParams.begin()->second.lenParam )
              {
                if ( returnParams[1] == vectorParams.begin()->first )
                {
                  return generateCommandSetInclusive( name,
                                                      commandData,
                                                      initialSkipCount,
                                                      definition,
                                                      returnParams,
                                                      vectorParams,
                                                      false,
                                                      { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::withAllocator },
                                                      raii,
                                                      false,
                                                      { CommandFlavourFlagBits::enhanced } );
                }
              }
            }
          }
        }
      }
      break;
    default: break;
  }
  return "";
}